

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_conversion.cc
# Opt level: O3

bool absl::lts_20250127::str_format_internal::ConvertFloatImpl
               (longdouble v,FormatConversionSpecImpl *conv,FormatSinkImpl *sink)

{
  long lVar1;
  string_view data_postfix;
  Decomposed<long_double> decomposed_00;
  Decomposed<long_double> decomposed_01;
  unkbyte10 Var2;
  bool bVar3;
  Flags FVar4;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  FormatConversionChar FVar12;
  byte bVar13;
  size_t padding_offset;
  char *pcVar14;
  undefined1 *puVar15;
  size_t sVar16;
  anon_unknown_0 *paVar17;
  uint uVar18;
  int iVar19;
  FormatState *in_R8;
  ulong uVar20;
  uint uVar21;
  size_t in_R9;
  ulong uVar22;
  byte bVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  anon_unknown_0 *paVar28;
  int total_bits;
  ulong uVar29;
  ulong uVar30;
  size_t trailing_zeros;
  ulong uVar31;
  longdouble lVar32;
  longdouble in_ST1;
  string_view value;
  uint128 v_00;
  uint128 v_01;
  string_view str;
  uint128 v_02;
  string_view data;
  uint128 v_03;
  uint128 v_04;
  int shift;
  char digits_buffer [20];
  Decomposed<long_double> decomposed;
  Buffer buffer;
  Buffer *pBVar33;
  undefined2 uVar34;
  undefined6 in_stack_fffffffffffffe42;
  undefined6 uVar35;
  uint local_19c;
  longdouble local_198;
  longdouble local_18c;
  FormatState local_180;
  ulong local_160;
  long local_158;
  ushort uStack_150;
  char local_148;
  byte local_147;
  char local_146;
  undefined1 local_145;
  undefined1 local_144 [28];
  uint128 local_128;
  uint local_118;
  undefined4 uStack_114;
  undefined8 uStack_110;
  int local_fc;
  undefined1 local_f8 [16];
  Buffer local_e8;
  
  local_f8._0_10_ = v;
  Var2 = local_f8._0_10_;
  local_f8._8_2_ = (undefined2)((unkuint10)v >> 0x40);
  if ((short)local_f8._8_2_ < 0) {
    lVar32 = -v;
    bVar23 = 0x2d;
LAB_003390c8:
    pBVar33 = (Buffer *)(local_e8.data + 1);
    local_e8.data[0] = bVar23;
  }
  else {
    bVar23 = 0x2b;
    lVar32 = v;
    if (((conv->flags_ & kShowPos) != kBasic) ||
       (bVar23 = 0x20, (conv->flags_ & kSignCol) != kBasic)) goto LAB_003390c8;
    pBVar33 = &local_e8;
    bVar23 = 0;
  }
  local_18c = v;
  local_f8._0_10_ = Var2;
  if (NAN(lVar32)) {
    FVar12 = conv->conv_;
    pcVar14 = "NAN";
    pcVar7 = "nan";
LAB_00339122:
    if ((FVar12 & ~x) == F) {
      pcVar7 = pcVar14;
    }
    if (FVar12 == X) {
      pcVar7 = pcVar14;
    }
    pBVar33->data[2] = pcVar7[2];
    *(undefined2 *)pBVar33->data = *(undefined2 *)pcVar7;
    value._M_len = (long)pBVar33 + (3 - (long)&local_e8);
    uVar21 = conv->flags_ & 1;
    in_R9 = (size_t)uVar21;
    in_R8 = (FormatState *)0xffffffff;
    value._M_str = local_e8.data;
    local_198 = lVar32;
    bVar3 = FormatSinkImpl::PutPaddedString(sink,value,conv->width_,-1,SUB41(uVar21,0));
    if (bVar3) {
      return true;
    }
  }
  else {
    local_158 = SUB108(lVar32,0);
    uStack_150 = (ushort)((unkuint10)lVar32 >> 0x40);
    if ((~uStack_150 & 0x7fff) == 0 && local_158 == -0x8000000000000000) {
      FVar12 = conv->conv_;
      pcVar14 = "INF";
      pcVar7 = "inf";
      goto LAB_00339122;
    }
  }
  local_198 = (longdouble)CONCAT28(local_198._8_2_,sink);
  uVar30 = 6;
  if (-1 < conv->precision_) {
    uVar30 = (ulong)(uint)conv->precision_;
  }
  local_19c = 0;
  frexpl(&local_fc);
  ldexpl(0x40);
  uVar21 = local_fc - 0x40;
  uVar34 = (undefined2)((unkuint10)in_ST1 >> 0x40);
  uint128::uint128(&local_128,in_ST1);
  FVar12 = conv->conv_;
  bVar3 = false;
  uVar35 = (undefined6)(local_128.hi_ >> 0x10);
  local_180.sign_char = bVar23;
  local_180.precision = uVar30;
  local_180.conv = conv;
  local_118 = uVar21;
  switch(FVar12 & ~s) {
  case f:
    local_180.sink = local_198._0_8_;
    if (local_fc < 0x40) {
      if (0xffffff7f < uVar21) {
        local_e8.data[0x2a] = '.';
        uVar18 = 0x40 - local_fc;
        if (uVar21 == 0xffffff80) {
          pcVar14 = local_e8.data + 0x29;
          local_e8.data[0x29] = '0';
        }
        else {
          bVar23 = (byte)uVar18 & 0x3f;
          paVar28 = (anon_unknown_0 *)(local_128.hi_ >> ((byte)uVar18 & 0x3f));
          paVar17 = (anon_unknown_0 *)0x0;
          if ((uVar18 & 0x40) == 0) {
            paVar17 = paVar28;
            paVar28 = (anon_unknown_0 *)(local_128.lo_ >> bVar23 | local_128.hi_ << 0x40 - bVar23);
          }
          v_00.hi_ = (uint64_t)(local_e8.data + 0x2a);
          v_00.lo_ = (uint64_t)paVar17;
          pcVar14 = anon_unknown_0::PrintIntegralDigitsFromRightFast
                              (paVar28,v_00,(char *)(ulong)uVar18);
        }
        pcVar14[-1] = '0';
        v_01.hi_ = (uint64_t)(local_e8.data + 0x2b);
        v_01.lo_ = local_128.hi_;
        pcVar9 = anon_unknown_0::PrintFractionalDigitsFast
                           ((anon_unknown_0 *)local_128.lo_,v_01,(char *)(ulong)uVar18,
                            (int)local_180.precision,in_R9);
        pcVar7 = pcVar14 + -1;
        if (pcVar14[-1] == '0') {
          pcVar7 = pcVar14;
        }
        goto LAB_00339715;
      }
      v_03.hi_._0_4_ = 0x40 - local_fc;
      v_03.lo_ = local_128.hi_;
      v_03.hi_._4_4_ = 0;
      anon_unknown_0::FormatFNegativeExpSlow
                ((anon_unknown_0 *)local_128.lo_,v_03,(int)&local_180,in_R8);
    }
    else {
      lVar11 = 0x3f;
      if (local_128.hi_ != 0) {
        for (; local_128.hi_ >> lVar11 == 0; lVar11 = lVar11 + -1) {
        }
      }
      if ((anon_unknown_0 *)local_128.lo_ == (anon_unknown_0 *)0x0) {
        uVar18 = 0x40;
      }
      else {
        lVar1 = 0x3f;
        if ((anon_unknown_0 *)local_128.lo_ != (anon_unknown_0 *)0x0) {
          for (; local_128.lo_ >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        uVar18 = (uint)lVar1 ^ 0x3f;
      }
      uVar6 = (uint)lVar11 ^ 0x3f;
      if (local_128.hi_ == 0) {
        uVar6 = uVar18 + 0x40;
      }
      iVar5 = (local_fc - uVar6) + 0x40;
      if (iVar5 < 0x81) {
        pcVar7 = local_e8.data + 0x2a;
        local_e8.data[0x2a] = '.';
        pcVar9 = local_e8.data + 0x2b;
        bVar23 = (byte)uVar21;
        if (iVar5 < 0x41) {
          uVar30 = local_128.lo_ << (bVar23 & 0x3f);
          do {
            pcVar7[-1] = (char)uVar30 + (char)(uVar30 / 10) * -10 | 0x30;
            pcVar7 = pcVar7 + -1;
            bVar3 = 9 < uVar30;
            uVar30 = uVar30 / 10;
          } while (bVar3);
        }
        else {
          paVar28 = (anon_unknown_0 *)(local_128.lo_ << (bVar23 & 0x3f));
          paVar17 = (anon_unknown_0 *)0x0;
          if ((uVar21 & 0x40) == 0) {
            paVar17 = paVar28;
            paVar28 = (anon_unknown_0 *)
                      (local_128.hi_ << (bVar23 & 0x3f) | local_128.lo_ >> 0x40 - (bVar23 & 0x3f));
          }
          v_02.hi_ = (uint64_t)pcVar7;
          v_02.lo_ = (uint64_t)paVar28;
          pcVar7 = anon_unknown_0::PrintIntegralDigitsFromRightFast
                             (paVar17,v_02,(char *)(ulong)uVar21);
        }
LAB_00339715:
        sVar16 = (long)pcVar9 - (long)pcVar7;
        if ((local_180.precision == 0) && (((local_180.conv)->flags_ & kAlt) == kBasic)) {
          sVar16 = sVar16 - 1;
        }
        trailing_zeros = (long)&local_e8 + (local_180.precision - (long)pcVar9) + 0x2b;
        pBVar33 = (Buffer *)0x388271;
        padding_offset = 0;
        goto LAB_00339918;
      }
      v_04.hi_._0_4_ = uVar21;
      v_04.lo_ = local_128.hi_;
      v_04.hi_._4_4_ = 0;
      anon_unknown_0::FormatFPositiveExpSlow
                ((anon_unknown_0 *)local_128.lo_,v_04,(int)&local_180,in_R8);
    }
    break;
  case e:
    decomposed_01._20_4_ = uStack_114;
    decomposed_01.exponent = uVar21;
    decomposed_01.mantissa.hi_._0_2_ = (short)local_128.hi_;
    decomposed_01.mantissa.lo_ = local_128.lo_;
    decomposed_01.mantissa.hi_._2_6_ = uVar35;
    decomposed_01._24_8_ = uStack_110;
    bVar3 = (anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
                      (decomposed_01,uVar30,&local_e8,(int *)&local_19c);
    if (!bVar3) {
LAB_00339334:
      bVar3 = anon_unknown_0::FallbackToSnprintf<long_double>(local_18c,conv,local_198._0_8_);
      return bVar3;
    }
    uVar21 = local_19c;
    if ((conv->flags_ & kAlt) == kBasic) {
      if (local_e8.end <= local_e8.begin) {
LAB_003395ec:
        __assert_fail("begin < end",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3fc,
                      "char &absl::str_format_internal::(anonymous namespace)::Buffer::back() const"
                     );
      }
      if (local_e8.end[-1] == '.') {
        local_e8.end = local_e8.end + -1;
      }
    }
LAB_0033961c:
    bVar13 = 0x45;
    if (conv->conv_ != X) {
      bVar13 = ((conv->conv_ & ~x) != F) << 5 | 0x45;
    }
    anon_unknown_0::PrintExponent(uVar21,bVar13,&local_e8);
    FVar4 = conv->flags_;
    goto LAB_0033964d;
  case g:
    uVar20 = 1;
    if (uVar30 != 0) {
      uVar20 = uVar30;
    }
    decomposed_00._20_4_ = uStack_114;
    decomposed_00.exponent = uVar21;
    decomposed_00.mantissa.hi_._0_2_ = (short)local_128.hi_;
    decomposed_00.mantissa.lo_ = local_128.lo_;
    decomposed_00.mantissa.hi_._2_6_ = uVar35;
    decomposed_00._24_8_ = uStack_110;
    bVar3 = (anonymous_namespace)::
            FloatToBuffer<(absl::lts_20250127::str_format_internal::(anonymous_namespace)::FormatStyle)1,long_double>
                      (decomposed_00,uVar20 - 1,&local_e8,(int *)&local_19c);
    if (!bVar3) goto LAB_00339334;
    uVar30 = (ulong)(int)local_19c;
    uVar21 = local_19c;
    if ((long)uVar30 < 0) {
      if (0xfffffffb < local_19c) {
        local_e8.begin[1] = *local_e8.begin;
        if (local_19c != 0xffffffff) {
          iVar5 = local_19c + 1;
          do {
            pcVar7 = local_e8.begin + -1;
            *local_e8.begin = '0';
            iVar5 = iVar5 + 1;
            local_e8.begin = pcVar7;
          } while (iVar5 != 0);
        }
        *local_e8.begin = '.';
        local_e8.begin[-1] = '0';
        uVar21 = 0;
        local_e8.begin = local_e8.begin + -1;
      }
    }
    else if (uVar30 < uVar20) {
      uVar21 = 0;
      if (local_19c != 0) {
        std::_V2::__rotate<char*>(local_e8.begin + 1,local_e8.begin + 2,local_e8.begin + uVar30 + 2)
        ;
        uVar21 = 0;
      }
    }
    FVar4 = conv->flags_;
    pcVar7 = local_e8.end;
    if ((FVar4 & kAlt) == kBasic) {
      do {
        local_e8.end = pcVar7;
        if (local_e8.end <= local_e8.begin) goto LAB_003395ec;
        pcVar7 = local_e8.end + -1;
      } while (*pcVar7 == '0');
      if (*pcVar7 == '.') {
        local_e8.end = pcVar7;
      }
    }
    if (uVar21 != 0) goto LAB_0033961c;
LAB_0033964d:
    str._M_len = (long)local_e8.end - (long)local_e8.begin;
    str._M_str = local_e8.begin;
    anon_unknown_0::WriteBufferToSink
              (bVar23,str,(FormatConversionSpecImpl *)(ulong)FVar4,
               (FormatSinkImpl *)(ulong)(uint)conv->width_);
    break;
  case a:
    local_180.sink = local_198._0_8_;
    iVar5 = conv->precision_;
    local_fc = local_fc + 0x40;
    if ((anon_unknown_0 *)local_128.lo_ != (anon_unknown_0 *)0x0 || local_128.hi_ != 0) {
      iVar19 = -0x3ffe;
      if (local_fc < -0x3ffe) {
        iVar19 = local_fc;
      }
      do {
        if ((long)local_128.hi_ < 0) goto LAB_003393be;
        if (local_fc < -0x3ffd) {
          bVar23 = 2 - (char)iVar19;
          uVar29 = local_128.hi_ >> (bVar23 & 0x3f);
          uVar24 = 0;
          uVar22 = uVar29;
          uVar20 = local_128.lo_ >> (bVar23 & 0x3f) | local_128.hi_ << 0x40 - (bVar23 & 0x3f);
          if ((bVar23 & 0x40) != 0) {
            uVar22 = 0;
            uVar20 = uVar29;
          }
          uVar29 = 0xffffc002;
          goto LAB_003393dc;
        }
        local_128.hi_ = local_128.hi_ << 1 | local_128.lo_ >> 0x3f;
        local_128.lo_ = local_128.lo_ * 2;
        local_fc = local_fc + -1;
      } while ((anon_unknown_0 *)local_128.lo_ != (anon_unknown_0 *)0x0 || local_128.hi_ != 0);
    }
    local_128.hi_ = 0;
    local_128.lo_ = 0;
LAB_003393be:
    uVar24 = local_128.hi_ >> 0x3c;
    uVar29 = (ulong)(local_fc - 4);
    if ((anon_unknown_0 *)local_128.lo_ == (anon_unknown_0 *)0x0 && local_128.hi_ == 0) {
      uVar29 = 0;
    }
    uVar22 = local_128.hi_ << 4 | local_128.lo_ >> 0x3c;
    uVar20 = local_128.lo_ << 4;
LAB_003393dc:
    if (-1 < iVar5) {
      uVar27 = 0;
      uVar31 = 0x20 - uVar30;
      if (0x20 < uVar30) {
        uVar31 = uVar27;
      }
      uVar25 = 0xffffffffffffffff;
      if ((uint)uVar30 < 0x20) {
        local_198 = (longdouble)CONCAT64(local_198._4_6_,iVar5);
        uVar18 = (int)uVar31 * 4;
        local_160 = (ulong)uVar18;
        uVar21 = (int)uVar31 * -4 + 0x80;
        uVar26 = 0xffffffffffffffff >> ((byte)uVar21 & 0x3f);
        local_18c = (longdouble)CONCAT64(local_18c._4_6_,uVar21);
        uVar25 = uVar26;
        uVar27 = 0;
        if ((uVar21 & 0x40) == 0) {
          uVar25 = 0xffffffffffffffff;
          uVar27 = uVar26;
        }
        bVar13 = (byte)(uVar18 - 4);
        bVar23 = bVar13 & 0x3f;
        uVar8 = 8L << (bVar13 & 0x3f);
        uVar27 = uVar27 & uVar22;
        uVar10 = uVar8;
        uVar26 = 0L << bVar23 | 8UL >> 0x40 - bVar23;
        if ((uVar18 - 4 & 0x40) != 0) {
          uVar10 = 0;
          uVar26 = uVar8;
        }
        bVar23 = (byte)uVar18;
        if ((uVar20 & uVar25) == uVar10 && uVar27 == uVar26) {
          uVar27 = uVar24;
          if (uVar31 != 0x20) {
            uVar27 = 0xfL << (bVar23 & 0x3f);
            uVar10 = uVar27;
            uVar26 = 0L << (bVar23 & 0x3f) | 0xfUL >> 0x40 - (bVar23 & 0x3f);
            if ((uVar18 & 0x40) != 0) {
              uVar10 = 0;
              uVar26 = uVar27;
            }
            uVar27 = (uVar26 & uVar22) >> (bVar23 & 0x3f);
            if ((uVar18 & 0x40) == 0) {
              uVar27 = (uVar10 & uVar20) >> (bVar23 & 0x3f) |
                       (uVar26 & uVar22) << 0x40 - (bVar23 & 0x3f);
            }
          }
          if ((uVar27 & 1) != 0) {
LAB_00339765:
            uVar10 = 1L << (bVar23 & 0x3f);
            uVar8 = 0;
            uVar26 = uVar10;
            uVar27 = 0L << (bVar23 & 0x3f) | 1UL >> 0x40 - (bVar23 & 0x3f);
            if ((uVar18 & 0x40) != 0) {
              uVar26 = uVar8;
              uVar27 = uVar10;
            }
            if (0x1f < uVar31) {
              uVar27 = uVar8;
              uVar26 = uVar8;
            }
            bVar3 = CARRY8(uVar20,uVar26);
            uVar20 = uVar20 + uVar26;
            uVar27 = uVar27 + uVar22 + (ulong)bVar3;
            bVar23 = (char)uVar24 + (-1 < (long)uVar27 && (long)uVar22 < 0 || 0x1f < uVar31);
            uVar24 = (ulong)bVar23;
            uVar22 = uVar27;
            if (0xf < bVar23) {
              uVar29 = (ulong)((int)uVar29 + 4);
              uVar24 = 1;
              uVar20 = 0;
              uVar22 = 0;
            }
          }
        }
        else if (uVar26 < uVar27 || uVar26 - uVar27 < (ulong)(uVar10 < (uVar20 & uVar25)))
        goto LAB_00339765;
        bVar23 = (byte)uVar21 & 0x3f;
        uVar27 = 0xffffffffffffffffU >> bVar23 | 0L << 0x40 - bVar23;
        if ((uVar21 & 0x40) != 0) {
          uVar27 = 0;
        }
        uVar25 = ~uVar25;
      }
      uVar20 = uVar20 & uVar25;
      uVar22 = uVar22 & ~uVar27;
    }
    lVar11 = (ulong)(FVar12 != A) * 0x10;
    local_147 = (FVar12 != A) << 5 | 0x58;
    local_148 = '0';
    local_146 = "0123456789ABCDEF0123456789abcdef"[uVar24 + lVar11];
    if ((((iVar5 < 0) || ((uint)uVar30 == 0)) && ((-1 < iVar5 || (uVar20 == 0 && uVar22 == 0)))) &&
       ((conv->flags_ & kAlt) == kBasic)) {
      puVar15 = &local_145;
    }
    else {
      puVar15 = local_144;
      local_145 = 0x2e;
    }
    if (uVar20 == 0 && uVar22 == 0) {
      uVar24 = 0;
    }
    else {
      uVar24 = 0;
      do {
        puVar15[uVar24] = "0123456789ABCDEF0123456789abcdef"[(uVar22 >> 0x3c) + lVar11];
        uVar22 = uVar22 << 4 | uVar20 >> 0x3c;
        uVar20 = uVar20 << 4;
        uVar24 = uVar24 + 1;
      } while (uVar20 != 0 || uVar22 != 0);
      puVar15 = puVar15 + uVar24;
    }
    if (iVar5 < 0) {
      trailing_zeros = 0;
    }
    else {
      trailing_zeros = uVar30 - uVar24;
      if (uVar30 < uVar24) {
        __assert_fail("state.precision >= digits_emitted",
                      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/strings/internal/str_format/float_conversion.cc"
                      ,0x3a5,
                      "void absl::str_format_internal::(anonymous namespace)::FormatA(const HexFloatTypeParams, Int, int, bool, const FormatState &) [Int = absl::uint128]"
                     );
      }
    }
    pcVar7 = &local_148;
    sVar16 = (long)puVar15 - (long)pcVar7;
    local_e8.data[0] = (FVar12 != A) << 5 | 0x50;
    local_e8.data[1] = (char)(uVar29 >> 0x1f) * '\x02' + '+';
    iVar19 = (int)uVar29;
    iVar5 = -iVar19;
    if (0 < iVar19) {
      iVar5 = iVar19;
    }
    numbers_internal::FastIntToBuffer(iVar5,local_e8.data + 2);
    pBVar33 = &local_e8;
    strlen(pBVar33->data);
    padding_offset = 2;
LAB_00339918:
    data_postfix._M_str._0_2_ = uVar34;
    data_postfix._M_len = (size_t)pBVar33;
    data_postfix._M_str._2_6_ = in_stack_fffffffffffffe42;
    data._M_str = pcVar7;
    data._M_len = sVar16;
    anon_unknown_0::FinalPrint(&local_180,data,padding_offset,trailing_zeros,data_postfix);
    break;
  default:
    goto switchD_003391f2_default;
  }
  bVar3 = true;
switchD_003391f2_default:
  return bVar3;
}

Assistant:

bool ConvertFloatImpl(long double v, const FormatConversionSpecImpl &conv,
                      FormatSinkImpl *sink) {
  if (IsDoubleDouble()) {
    // This is the `double-double` representation of `long double`. We do not
    // handle it natively. Fallback to snprintf.
    return FallbackToSnprintf(v, conv, sink);
  }

  return FloatToSink(v, conv, sink);
}